

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view name,
          bool cap_first_letter)

{
  _anonymous_namespace_ _Var1;
  char cVar2;
  int i;
  _anonymous_namespace_ *p_Var3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var3 = (_anonymous_namespace_ *)0x0;
  do {
    cVar2 = (char)__return_storage_ptr__;
    if (this == p_Var3) {
      if (this[name._M_len - 1] == (_anonymous_namespace_)0x23) {
        std::__cxx11::string::push_back(cVar2);
      }
      return __return_storage_ptr__;
    }
    _Var1 = p_Var3[name._M_len];
    if ((char)_Var1 < 'a') {
      if ((char)_Var1 < 'A') {
        if ((byte)((char)_Var1 - 0x30U) < 10) {
          std::__cxx11::string::push_back(cVar2);
        }
      }
      else if ((byte)_Var1 < 0x5b) goto LAB_0027027a;
    }
    else if ((byte)_Var1 < 0x7b) {
LAB_0027027a:
      std::__cxx11::string::push_back(cVar2);
    }
    p_Var3 = p_Var3 + 1;
  } while( true );
}

Assistant:

std::string UnderscoresToCamelCase(absl::string_view name,
                                   bool cap_first_letter) {
  std::string result;
  for (int i = 0; i < name.size(); i++) {
    if ('a' <= name[i] && name[i] <= 'z') {
      if (cap_first_letter) {
        result += name[i] + ('A' - 'a');
      } else {
        result += name[i];
      }
      cap_first_letter = false;
    } else if ('A' <= name[i] && name[i] <= 'Z') {
      if (i == 0 && !cap_first_letter) {
        // Force first letter to lower-case unless explicitly told to
        // capitalize it.
        result += name[i] + ('a' - 'A');
      } else {
        // Capital letters after the first are left as-is.
        result += name[i];
      }
      cap_first_letter = false;
    } else if ('0' <= name[i] && name[i] <= '9') {
      result += name[i];
      cap_first_letter = true;
    } else {
      cap_first_letter = true;
    }
  }
  // Add a trailing "_" if the name should be altered.
  if (name[name.size() - 1] == '#') {
    result += '_';
  }
  return result;
}